

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.hpp
# Opt level: O0

void print_cnt(vector<std::vector<tensor_*,_std::allocator<tensor_*>_>,_std::allocator<std::vector<tensor_*,_std::allocator<tensor_*>_>_>_>
               *w)

{
  size_type sVar1;
  reference pvVar2;
  reference pptVar3;
  ostream *poVar4;
  int local_18;
  int local_14;
  int j;
  int i;
  vector<std::vector<tensor_*,_std::allocator<tensor_*>_>,_std::allocator<std::vector<tensor_*,_std::allocator<tensor_*>_>_>_>
  *w_local;
  
  local_14 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::vector<tensor_*,_std::allocator<tensor_*>_>,_std::allocator<std::vector<tensor_*,_std::allocator<tensor_*>_>_>_>
            ::size(w);
    if (sVar1 <= (ulong)(long)local_14) break;
    local_18 = 0;
    while( true ) {
      pvVar2 = std::
               vector<std::vector<tensor_*,_std::allocator<tensor_*>_>,_std::allocator<std::vector<tensor_*,_std::allocator<tensor_*>_>_>_>
               ::operator[](w,0);
      sVar1 = std::vector<tensor_*,_std::allocator<tensor_*>_>::size(pvVar2);
      if (sVar1 <= (ulong)(long)local_18) break;
      pvVar2 = std::
               vector<std::vector<tensor_*,_std::allocator<tensor_*>_>,_std::allocator<std::vector<tensor_*,_std::allocator<tensor_*>_>_>_>
               ::operator[](w,(long)local_14);
      pptVar3 = std::vector<tensor_*,_std::allocator<tensor_*>_>::operator[](pvVar2,(long)local_18);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(*pptVar3)->cnt);
      std::operator<<(poVar4," ");
      local_18 = local_18 + 1;
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void print_cnt(vector<vector<tensor *>> w){
    for(int i=0;i<w.size();i++){
        for(int j=0;j<w[0].size();j++){
            cout<<w[i][j]->cnt<<" ";
        }
        cout<<endl;
    }
//    for(int i=0;i<w.size();i++){
//        for(int j=0;j<w[0].size();j++){
//            cout<<w[i][j]->grad<<" ";
//        }
//        cout<<endl;
//    }
}